

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ListCosineSimilarityFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunction *func;
  pointer function;
  ScalarFunctionSet *in_RDI;
  pointer child;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcdc;
  FunctionNullHandling in_stack_fffffffffffffce8;
  bind_lambda_function_t in_stack_fffffffffffffcf0;
  scalar_function_t local_300;
  vector<duckdb::ScalarFunction,_true> *local_2e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d8;
  undefined1 local_2c0 [48];
  LogicalType *local_290;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_288;
  string local_270;
  LogicalType local_250;
  LogicalType local_238;
  LogicalType list;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string
            ((string *)&local_270,"list_cosine_similarity",(allocator *)&local_208);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_270);
  ::std::__cxx11::string::~string((string *)&local_270);
  LogicalType::Real();
  local_290 = local_288.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  child = local_288.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (child == local_290) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_288);
      pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
               super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                      ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
          function = function + 1) {
        BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction(&local_e0);
      }
      return in_RDI;
    }
    LogicalType::LIST(&list,child);
    if (child->id_ == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)local_2c0,&list);
      LogicalType::LogicalType((LogicalType *)(local_2c0 + 0x18),&list);
      __l_00._M_len = 2;
      __l_00._M_array = (LogicalType *)local_2c0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d8,__l_00,(allocator_type *)&stack0xfffffffffffffcf7);
      LogicalType::LogicalType(&local_238,child);
      local_300.super__Function_base._M_functor._8_8_ = 0;
      local_300.super__Function_base._M_functor._M_unused._M_object =
           ListGenericFold<double,duckdb::CosineSimilarityOp>;
      local_300._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_300.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_250,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_250;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcd4;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcdc;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_2d8,&local_238,&local_300,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                 in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_2e0->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      LogicalType::~LogicalType(&local_250);
      ::std::_Function_base::~_Function_base(&local_300.super__Function_base);
      LogicalType::~LogicalType(&local_238);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2c0 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    else {
      if (child->id_ != FLOAT) {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_208,"List function not implemented for type %s",
                   (allocator *)&local_300);
        LogicalType::ToString_abi_cxx11_((string *)local_2c0,child);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,(string *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
        __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LogicalType((LogicalType *)local_2c0,&list);
      LogicalType::LogicalType((LogicalType *)(local_2c0 + 0x18),&list);
      __l._M_len = 2;
      __l._M_array = (LogicalType *)local_2c0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d8,__l,(allocator_type *)&stack0xfffffffffffffcf7);
      LogicalType::LogicalType(&local_238,child);
      local_300.super__Function_base._M_functor._8_8_ = 0;
      local_300.super__Function_base._M_functor._M_unused._M_object =
           ListGenericFold<float,duckdb::CosineSimilarityOp>;
      local_300._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_300.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_250,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_250;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcd4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcdc;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_2d8,&local_238,&local_300,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                 in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_2e0->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      LogicalType::~LogicalType(&local_250);
      ::std::_Function_base::~_Function_base(&local_300.super__Function_base);
      LogicalType::~LogicalType(&local_238);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2c0 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    LogicalType::~LogicalType(&list);
    child = child + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet ListCosineSimilarityFun::GetFunctions() {
	ScalarFunctionSet set("list_cosine_similarity");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<CosineSimilarityOp>(set, type);
	}
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}